

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::enforceNotReservedTag(string *tag,SourceLineInfo *_lineInfo)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  Colour colourGuard_1;
  Colour colourGuard;
  SourceLineInfo *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  
  bVar1 = isReservedTag(in_stack_ffffffffffffffc0);
  if (!bVar1) {
    return;
  }
  Colour::Colour((Colour *)in_stack_ffffffffffffffc0,
                 (Code)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  poVar2 = cerr();
  poVar2 = std::operator<<(poVar2,"Tag name [");
  poVar2 = std::operator<<(poVar2,in_RDI);
  poVar2 = std::operator<<(poVar2,"] not allowed.\n");
  std::operator<<(poVar2,"Tag names starting with non alpha-numeric characters are reserved\n");
  Colour::~Colour((Colour *)0x1b0896);
  Colour::Colour((Colour *)poVar2,(Code)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  cerr();
  poVar2 = operator<<(poVar2,in_stack_ffffffffffffffb8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Colour::~Colour((Colour *)0x1b08d9);
  exit(1);
}

Assistant:

inline void enforceNotReservedTag( std::string const& tag, SourceLineInfo const& _lineInfo ) {
        if( isReservedTag( tag ) ) {
            {
                Colour colourGuard( Colour::Red );
                Catch::cerr()
                    << "Tag name [" << tag << "] not allowed.\n"
                    << "Tag names starting with non alpha-numeric characters are reserved\n";
            }
            {
                Colour colourGuard( Colour::FileName );
                Catch::cerr() << _lineInfo << std::endl;
            }
            exit(1);
        }
    }